

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_passthrough_reverse.c
# Opt level: O1

void test_passthrough_reverse(void)

{
  wchar_t wVar1;
  FILE *__s;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                  ,L'\x17',L'\0');
  __s = fopen("filelist","w");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                     ,L'\x1f',"dir",L'ǣ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                      ,L'\"',"dir/file",L'Ƥ',L'\xffffffff',"1234567890");
  fwrite("dir/file\n",9,1,__s);
  fwrite("dir\n",4,1,__s);
  fclose(__s);
  wVar1 = systemf("%s -pdvm out <filelist >stdout 2>stderr",testprog);
  failure("Error invoking %s -pd out",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                      ,L'1',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                  ,L'3',"out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
             ,L'7',"out/dir/file\nout/dir\n1 block\n","../stderr");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
             ,L'8',"../stdout");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                   ,L';',"dir",L'ǣ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                   ,L'?',"dir/file",L'Ƥ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
                      ,L'@',"dir/file",10);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_passthrough_reverse.c"
             ,L'A',"dir/file",L'\x01');
  return;
}

Assistant:

DEFINE_TEST(test_passthrough_reverse)
{
	int r;
	FILE *filelist;

	assertUmask(0);

	/*
	 * Create an assortment of files on disk.
	 */
	filelist = fopen("filelist", "w");

	/* Directory. */
	assertMakeDir("dir", 0743);

	/* File with 10 bytes content. */
	assertMakeFile("dir/file", 0644, "1234567890");
	fprintf(filelist, "dir/file\n");

	/* Write dir last. */
	fprintf(filelist, "dir\n");

	/* All done. */
	fclose(filelist);


	/*
	 * Use cpio passthrough mode to copy files to another directory.
	 */
	r = systemf("%s -pdvm out <filelist >stdout 2>stderr", testprog);
	failure("Error invoking %s -pd out", testprog);
	assertEqualInt(r, 0);

	assertChdir("out");

	/* Verify stderr and stdout. */
	assertTextFileContents("out/dir/file\nout/dir\n1 block\n",
	    "../stderr");
	assertEmptyFile("../stdout");

	/* dir */
	assertIsDir("dir", 0743);


	/* Regular file. */
	assertIsReg("dir/file", 0644);
	assertFileSize("dir/file", 10);
	assertFileNLinks("dir/file", 1);
}